

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLoop.cpp
# Opt level: O1

void __thiscall loop::MessageLoop::~MessageLoop(MessageLoop *this)

{
  _Manager_type p_Var1;
  SharedSemaphore *this_00;
  TaskInfo *pTVar2;
  bool bVar3;
  TaskInfo *in_RAX;
  TaskInfo *task;
  TaskInfo *local_28;
  
  local_28 = in_RAX;
  while( true ) {
    bVar3 = moodycamel::
            ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
            try_dequeue<loop::MessageLoop::TaskInfo*>
                      ((ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                        *)&this->m_quque,&local_28);
    pTVar2 = local_28;
    if (!bVar3) break;
    if (local_28 != (TaskInfo *)0x0) {
      p_Var1 = (local_28->task).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)((_Any_data *)&local_28->task,(_Any_data *)&local_28->task,__destroy_functor);
      }
      operator_delete(pTVar2);
    }
  }
  this_00 = this->m_sem;
  if (this_00 != (SharedSemaphore *)0x0) {
    myutils::SharedSemaphore::~SharedSemaphore(this_00);
    operator_delete(this_00);
  }
  moodycamel::
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_quque);
  moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_deleted_queue);
  return;
}

Assistant:

MessageLoop::~MessageLoop()
{
    TaskInfo* task;
    while (m_quque.try_dequeue(task)) delete task;
    delete m_sem;
}